

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_monitor.c
# Opt level: O1

void outputHandleDone(void *userData,wl_output *output)

{
  long lVar1;
  
  if ((*(int *)((long)userData + 0x88) < 1) || (*(int *)((long)userData + 0x8c) < 1)) {
    *(int *)((long)userData + 0x88) =
         (int)(((float)*(int *)(*(long *)((long)userData + 0x98) +
                               (long)*(int *)((long)userData + 0x10c) * 0x18) * 25.4) / 96.0);
    *(int *)((long)userData + 0x8c) =
         (int)(((float)*(int *)(*(long *)((long)userData + 0x98) + 4 +
                               (long)*(int *)((long)userData + 0x10c) * 0x18) * 25.4) / 96.0);
  }
  if (0 < (long)_glfw.monitorCount) {
    lVar1 = 0;
    do {
      if (_glfw.monitors[lVar1] == (_GLFWmonitor *)userData) {
        return;
      }
      lVar1 = lVar1 + 1;
    } while (_glfw.monitorCount != lVar1);
  }
  _glfwInputMonitor((_GLFWmonitor *)userData,0x40001,1);
  return;
}

Assistant:

static void outputHandleDone(void* userData, struct wl_output* output)
{
    struct _GLFWmonitor* monitor = userData;

    if (monitor->widthMM <= 0 || monitor->heightMM <= 0)
    {
        // If Wayland does not provide a physical size, assume the default 96 DPI
        const GLFWvidmode* mode = &monitor->modes[monitor->wl.currentMode];
        monitor->widthMM  = (int) (mode->width * 25.4f / 96.f);
        monitor->heightMM = (int) (mode->height * 25.4f / 96.f);
    }

    for (int i = 0; i < _glfw.monitorCount; i++)
    {
        if (_glfw.monitors[i] == monitor)
            return;
    }

    _glfwInputMonitor(monitor, GLFW_CONNECTED, _GLFW_INSERT_LAST);
}